

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationBuilder::addIfDifferent
          (CollationBuilder *this,UnicodeString *prefix,UnicodeString *str,int64_t *newCEs,
          int32_t newCEsLength,uint32_t ce32,UErrorCode *errorCode)

{
  ulong uVar1;
  ulong uVar2;
  int32_t iVar3;
  ulong uVar4;
  long local_128 [31];
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (ulong)(uint)newCEsLength;
    iVar3 = CollationDataBuilder::getCEs(this->dataBuilder,prefix,str,local_128,0);
    if (iVar3 == newCEsLength) {
      if (newCEsLength < 1) {
        return ce32;
      }
      if (*newCEs == local_128[0]) {
        uVar2 = 1;
        do {
          uVar4 = uVar2;
          if (uVar1 == uVar4) break;
          uVar2 = uVar4 + 1;
        } while (newCEs[uVar4] == local_128[uVar4]);
        if (uVar1 <= uVar4) {
          return ce32;
        }
      }
    }
    if (ce32 == 0xffffffff) {
      ce32 = (*(this->dataBuilder->super_UObject)._vptr_UObject[4])
                       (this->dataBuilder,newCEs,uVar1,errorCode);
    }
    CollationDataBuilder::addCE32(this->dataBuilder,prefix,str,ce32,errorCode);
  }
  return ce32;
}

Assistant:

uint32_t
CollationBuilder::addIfDifferent(const UnicodeString &prefix, const UnicodeString &str,
                                 const int64_t newCEs[], int32_t newCEsLength, uint32_t ce32,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return ce32; }
    int64_t oldCEs[Collation::MAX_EXPANSION_LENGTH];
    int32_t oldCEsLength = dataBuilder->getCEs(prefix, str, oldCEs, 0);
    if(!sameCEs(newCEs, newCEsLength, oldCEs, oldCEsLength)) {
        if(ce32 == Collation::UNASSIGNED_CE32) {
            ce32 = dataBuilder->encodeCEs(newCEs, newCEsLength, errorCode);
        }
        dataBuilder->addCE32(prefix, str, ce32, errorCode);
    }
    return ce32;
}